

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

TestResults __thiscall
ExternalTester::getError
          (ExternalTester *this,BaseFunction *f,TasmanianSparseGrid *grid,TestType type,
          vector<double,_std::allocator<double>_> *x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  TestResults TVar25;
  double local_d8;
  allocator_type local_c1;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> weights;
  vector<double,_std::allocator<double>_> points;
  vector<double,_std::allocator<double>_> r;
  value_type_conflict1 local_38;
  
  uVar1 = (**f->_vptr_BaseFunction)(f);
  uVar2 = (*f->_vptr_BaseFunction[1])(f);
  uVar3 = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  local_d8 = (double)CONCAT44(extraout_var,uVar3);
  lVar4 = (long)(int)uVar1;
  if (type < type_internal_interpolation) {
    uVar17 = 1;
    if (type == type_nodal_differentiation) {
      uVar17 = uVar1;
    }
    TasGrid::TasmanianSparseGrid::getPoints(&points,grid);
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (type == type_integration) {
      TasGrid::TasmanianSparseGrid::getQuadratureWeights(&y,grid);
    }
    else if (type == type_nodal_interpolation) {
      TasGrid::TasmanianSparseGrid::getInterpolationWeights((vector *)&y);
    }
    else {
      TasGrid::TasmanianSparseGrid::getDifferentiationWeights((vector *)&y);
    }
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&weights,&y.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&y.super__Vector_base<double,_std::allocator<double>_>);
    uVar17 = uVar17 * uVar2;
    std::vector<double,_std::allocator<double>_>::vector(&y,(long)(int)uVar17,(allocator_type *)&r);
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector(&r,(long)(int)uVar17,&local_38,&local_c1);
    if (type == type_nodal_differentiation) {
      uVar8 = 0;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = uVar8;
      }
      uVar12 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar12 = uVar8;
      }
      uVar11 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar11 = uVar8;
      }
      for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        (*f->_vptr_BaseFunction[3])
                  (f,points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar16 * lVar4,
                   y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
        lVar5 = 0;
        for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
          for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            *(double *)
             ((long)r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar13 * 8 + lVar5) =
                 *(double *)
                  ((long)weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar13 * 8 + uVar8) *
                 y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6] +
                 *(double *)
                  ((long)r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar13 * 8 + lVar5);
          }
          lVar5 = lVar5 + lVar4 * 8;
        }
        uVar8 = uVar8 + lVar4 * 8;
      }
    }
    else {
      uVar9 = 0;
      uVar8 = 0;
      if (0 < (int)uVar17) {
        uVar8 = (ulong)uVar17;
      }
      uVar12 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar12 = uVar9;
      }
      for (; uVar9 != uVar12; uVar9 = uVar9 + 1) {
        (*f->_vptr_BaseFunction[3])
                  (f,points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar9 * lVar4,
                   y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar11] =
               weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] *
               y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar11] +
               r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar11];
        }
      }
    }
    if (type == type_integration) {
      (*f->_vptr_BaseFunction[4])
                (f,y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
    }
    else {
      (*f->_vptr_BaseFunction[(ulong)(type == type_nodal_differentiation) * 2 + 3])
                (f,(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start,
                 y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    uVar8 = 0;
    uVar9 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar9 = uVar8;
    }
    local_d8 = 0.0;
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      local_d8 = local_d8 +
                 ABS(y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8] -
                     r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8]);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&r.super__Vector_base<double,_std::allocator<double>_>);
  }
  else {
    if (1 < type - type_internal_interpolation) goto LAB_00117f1e;
    loadValues(f,grid);
    genRandom(&points,this->num_mc,uVar1);
    uVar3 = 1;
    if (type != type_internal_interpolation) {
      uVar3 = uVar1;
    }
    uVar2 = uVar2 * uVar3;
    lVar5 = (long)(int)uVar2;
    std::vector<double,_std::allocator<double>_>::vector
              (&weights,this->num_mc * lVar5,(allocator_type *)&y);
    std::vector<double,_std::allocator<double>_>::vector
              (&y,this->num_mc * lVar5,(allocator_type *)&r);
    if (type == type_internal_interpolation) {
      lVar14 = 0;
      lVar15 = 0;
      for (lVar10 = 0; uVar1 = this->num_mc, lVar10 < (int)uVar1; lVar10 = lVar10 + 1) {
        TasGrid::TasmanianSparseGrid::evaluate
                  ((double *)grid,
                   (double *)
                   ((long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar15));
        (*f->_vptr_BaseFunction[3])
                  (f,(long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar15,
                   (long)y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        lVar15 = lVar15 + lVar4 * 8;
        lVar14 = lVar14 + lVar5 * 8;
      }
    }
    else {
      lVar14 = 0;
      lVar15 = 0;
      for (lVar10 = 0; uVar1 = this->num_mc, lVar10 < (int)uVar1; lVar10 = lVar10 + 1) {
        TasGrid::TasmanianSparseGrid::differentiate
                  ((double *)grid,
                   (double *)
                   ((long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar15));
        (*f->_vptr_BaseFunction[5])
                  (f,(long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar15,
                   (long)y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
        lVar15 = lVar15 + lVar4 * 8;
        lVar14 = lVar14 + lVar5 * 8;
      }
    }
    uVar8 = 0;
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar8;
    }
    uVar12 = 0;
    if (0 < (int)uVar2) {
      uVar12 = (ulong)uVar2;
    }
    local_d8 = 0.0;
    pdVar7 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (; uVar8 != uVar12; uVar8 = uVar8 + 1) {
      dVar21 = 0.0;
      dVar22 = 0.0;
      lVar4 = 0;
      uVar11 = uVar9;
      while (bVar18 = uVar11 != 0, uVar11 = uVar11 - 1, bVar18) {
        auVar23._0_8_ =
             ABS(*(double *)
                  ((long)y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4) -
                 *(double *)((long)pdVar7 + lVar4));
        auVar23._8_8_ =
             ABS(*(double *)
                  ((long)y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
        auVar24._8_8_ = dVar22;
        auVar24._0_8_ = dVar21;
        auVar24 = maxpd(auVar23,auVar24);
        lVar4 = lVar4 + lVar5 * 8;
        dVar21 = auVar24._0_8_;
        dVar22 = auVar24._8_8_;
      }
      dVar21 = (double)(~-(ulong)(ABS(dVar22) <= 1e-12) & (ulong)(dVar21 / dVar22) |
                       (ulong)dVar21 & -(ulong)(ABS(dVar22) <= 1e-12));
      if (dVar21 <= local_d8) {
        dVar21 = local_d8;
      }
      y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
           = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
      pdVar7 = pdVar7 + 1;
      local_d8 = dVar21;
    }
    if (type == type_internal_differentiation) {
      dVar21 = unitDerivativeTests(f,grid);
      uVar19 = SUB84(dVar21,0);
      uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
      if (dVar21 <= local_d8) {
        uVar19 = SUB84(local_d8,0);
        uVar20 = (undefined4)((ulong)local_d8 >> 0x20);
      }
      local_d8 = (double)CONCAT44(uVar20,uVar19);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&points.super__Vector_base<double,_std::allocator<double>_>);
LAB_00117f1e:
  TVar25.num_points = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  TVar25._12_4_ = extraout_var_00;
  TVar25.error = local_d8;
  return TVar25;
}

Assistant:

TestResults ExternalTester::getError(const BaseFunction *f, TasGrid::TasmanianSparseGrid &grid, TestType type, std::vector<double> const &x) const{
    TestResults R;
    int num_dimensions = f->getNumInputs();
    int num_outputs = f->getNumOutputs();
    int num_points = grid.getNumPoints();
    if (type == type_integration or type == type_nodal_interpolation or type == type_nodal_differentiation){
        int num_entries = (type == type_nodal_differentiation) ? num_dimensions * num_outputs : num_outputs;
        auto points = grid.getPoints();
        std::vector<double> weights;
        if (type == type_integration)
            weights = grid.getQuadratureWeights();
        else if (type == type_nodal_interpolation)
            weights = grid.getInterpolationWeights(x);
        else
            weights = grid.getDifferentiationWeights(x);

        // Sequential version
        std::vector<double> y(num_entries);
        std::vector<double> r(num_entries, 0.0);
        if (type == type_nodal_differentiation){
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for (int k=0; k<num_outputs; k++)
                    for(int j=0; j<num_dimensions; j++)
                        r[k * num_dimensions + j] += weights[i * num_dimensions + j] * y[k];
            }
        }else{
            for(int i=0; i<num_points; i++){
                f->eval(&(points[i*num_dimensions]), y.data());
                for(int k=0; k<num_entries; k++)
                    r[k] += weights[i] * y[k];
            }
        }

        double err = 0.0;
        if (type == type_integration){
            f->getIntegral(y.data());
        }else if (type == type_nodal_differentiation){
            f->getDerivative(x.data(), y.data());
        }else{
            f->eval(x.data(), y.data());
        }
        for(int j=0; j<num_entries; j++){
            err += std::abs(y[j] - r[j]);
        };
        R.error = err;
    }else if (type == type_internal_interpolation or type == type_internal_differentiation){
        // load needed points
        loadValues(f, grid);

        std::vector<double> test_x = genRandom(num_mc, num_dimensions);
        int num_entries = (type == type_internal_interpolation) ? num_outputs : num_outputs * num_dimensions;
        std::vector<double> result_tasm(num_mc * num_entries);
        std::vector<double> result_true(num_mc * num_entries);
        if (type == type_internal_interpolation) {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.evaluate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->eval(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        } else {
            #pragma omp parallel for // note that iterators do not work with OpenMP, direct indexing does
            for(int i=0; i<num_mc; i++){
                grid.differentiate(&(test_x[i * num_dimensions]), &(result_tasm[i * num_entries]));
                f->getDerivative(&(test_x[i * num_dimensions]), &(result_true[i * num_entries]));
            }
        }

        double rel_err = 0.0; // relative error
        for(int k=0; k<num_entries; k++){
            double nrm = 0.0; // norm, needed to compute relative error
            double err = 0.0; // absolute error
            for(int i=0; i<num_mc; i++){
                nrm = std::max(nrm, std::fabs(result_true[i * num_entries + k]));
                err = std::max(err, std::fabs(result_true[i * num_entries + k] - result_tasm[i * num_entries + k]));
            }
            rel_err = std::max(rel_err, std::fabs(nrm) <= Maths::num_tol ? err : err / nrm);
        }

        if (type == type_internal_differentiation)
            rel_err = std::max(rel_err, unitDerivativeTests(f, grid));

        R.error = rel_err;
    }
    R.num_points = grid.getNumPoints();
    return R;
}